

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::drawSegment(Renderer *this,Vector3 *u,Vector3 *v,Mat *img,Scalar *color)

{
  double *pdVar1;
  Camera *in_RDX;
  double tmp;
  Vector3 pos;
  Vector3 vec;
  double t;
  double intvl;
  double len;
  Ray seg;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Vector3 *in_stack_fffffffffffffe38;
  Vector3 *in_stack_fffffffffffffe60;
  Vector3 *in_stack_fffffffffffffe68;
  double dVar2;
  Camera *this_00;
  undefined1 local_168 [32];
  Point_<int> local_148;
  undefined1 local_140 [24];
  Vector3 local_128;
  double local_110;
  Vector3 local_108;
  Vector3 *in_stack_ffffffffffffff10;
  Vector3 *in_stack_ffffffffffffff18;
  Vector3 *in_stack_ffffffffffffff20;
  World *in_stack_ffffffffffffff28;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  Vector3 local_a0;
  double local_88;
  Vector3 local_70 [4];
  
  this_00 = in_RDX;
  operator-(in_stack_fffffffffffffe38,
            (Vector3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  Ray::Ray((Ray *)in_RDX,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Vector3::~Vector3(local_70);
  operator-(in_stack_fffffffffffffe38,
            (Vector3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  dVar2 = Vector3::len((Vector3 *)0x123321);
  Vector3::~Vector3(&local_a0);
  local_b0 = 0.01;
  local_b8 = dVar2 / 50.0;
  local_88 = dVar2;
  pdVar1 = std::max<double>(&local_b0,&local_b8);
  local_a8 = *pdVar1;
  for (local_c0 = 0.0; local_c0 <= local_88; local_c0 = local_a8 + local_c0) {
    Ray::travel((Ray *)this_00,(double)in_RDX);
    Camera::getPixelPos(this_00,&in_RDX->O);
    Vector3::~Vector3(&local_108);
    operator-(in_stack_fffffffffffffe38,
              (Vector3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    dVar2 = World::getRadianceWithLight
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10);
    Vector3::~Vector3(&local_128);
    local_110 = dVar2 * 0.9 + 0.1;
    cv::_InputOutputArray::_InputOutputArray
              ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    pdVar1 = Vector3::operator[]((Vector3 *)&stack0xffffffffffffff10,0);
    in_stack_fffffffffffffe34 = (int)*pdVar1;
    in_stack_fffffffffffffe38 =
         (Vector3 *)Vector3::operator[]((Vector3 *)&stack0xffffffffffffff10,1);
    cv::Point_<int>::Point_(&local_148,in_stack_fffffffffffffe34,(int)in_stack_fffffffffffffe38->x);
    cv::operator*((Scalar_<double> *)in_stack_fffffffffffffe38,
                  (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    in_stack_fffffffffffffe28 = 0;
    cv::circle(local_140,&local_148,2,local_168,0xffffffff,8);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x12359d);
    Vector3::~Vector3((Vector3 *)&stack0xffffffffffffff10);
    Vector3::~Vector3((Vector3 *)&stack0xffffffffffffff28);
  }
  Ray::~Ray((Ray *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  return;
}

Assistant:

void Renderer::drawSegment(Vector3 u, Vector3 v, Mat &img, Scalar color)
{
    Ray seg(u, v - u);
    //cout << u << '\t' << v << endl;
    double len = (v - u).len(), intvl = max(0.01, len / 50);
    for (double t = 0; t <= len; t += intvl) {
        Vector3 vec(seg.travel(t));
        Vector3 pos = world.camera.getPixelPos(vec);
        double tmp = (0.1 + 0.9*world.getRadianceWithLight(vec, world.camera.O - vec, world.camera.O));// + 0.7/(world.camera.O - vec).len()*3);
        cv::circle(img, cv::Point(pos[0], pos[1]), 2, _color* tmp/* + (1-tmp)*Scalar(res.at<Vec3b>(min(max(0, (int)pos[1]), H), min(max(0, (int)pos[0]), H)))*/, -1);
    }
}